

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O0

void test_accept_bind_uds_stale_file_cant_remove(void)

{
  cio_address_family family;
  cio_error cVar1;
  int *piVar2;
  undefined1 local_5c4 [4];
  cio_error err;
  cio_socket_address endpoint;
  cio_server_socket ss;
  cio_eventloop loop;
  
  cio_init_uds_socket_address((cio_socket_address *)local_5c4,"/tmp/foobar");
  family = cio_socket_address_get_family((cio_socket_address *)local_5c4);
  cVar1 = cio_server_socket_init
                    ((cio_server_socket *)(endpoint.impl.sa.unix_address.un.sun_path + 0x66),
                     (cio_eventloop *)&ss.free_client,5,family,alloc_client,free_client,10,on_close)
  ;
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x32b,UNITY_DISPLAY_STYLE_INT);
  unlink_fake.return_val = -1;
  piVar2 = __errno_location();
  *piVar2 = 1;
  cVar1 = cio_server_socket_bind
                    ((cio_server_socket *)(endpoint.impl.sa.unix_address.un.sun_path + 0x66),
                     (cio_socket_address *)local_5c4);
  UnityAssertEqualNumber
            (-1,(long)cVar1,"bind did not fail if removal of udsw file failed",0x331,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(0,(ulong)close_fake.call_count,(char *)0x0,0x333,UNITY_DISPLAY_STYLE_INT);
  cio_server_socket_close((cio_server_socket *)(endpoint.impl.sa.unix_address.un.sun_path + 0x66));
  UnityAssertEqualNumber(1,(ulong)close_fake.call_count,(char *)0x0,0x335,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)unlink_fake.call_count,"unlink was not called",0x337,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_accept_bind_uds_stale_file_cant_remove(void)
{
	struct cio_eventloop loop;
	struct cio_server_socket ss;

	struct cio_socket_address endpoint;
	cio_init_uds_socket_address(&endpoint, "/tmp/foobar");

	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, cio_socket_address_get_family(&endpoint), alloc_client, free_client, 10, on_close);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	unlink_fake.return_val = -1;
	errno = EPERM;

	err = cio_server_socket_bind(&ss, &endpoint);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_NOT_PERMITTED, err, "bind did not fail if removal of udsw file failed");

	TEST_ASSERT_EQUAL(0, close_fake.call_count);
	cio_server_socket_close(&ss);
	TEST_ASSERT_EQUAL(1, close_fake.call_count);

	TEST_ASSERT_EQUAL_MESSAGE(1, unlink_fake.call_count, "unlink was not called");
}